

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

bool __thiscall
ON_Triangle::GetBarycentricCoordinates
          (ON_Triangle *this,ON_3dPoint *P,bool constrainInside,double *s1,double *s2)

{
  ulong uVar1;
  double dVar2;
  ON_3dPoint from_pt;
  ON_3dPoint from_pt_00;
  ON_3dPoint from_pt_01;
  ON_3dPoint to_pt;
  ON_3dPoint to_pt_00;
  ON_3dPoint to_pt_01;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  double *y;
  ulong uVar19;
  uint uVar20;
  int i_00;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ON_3dPoint *pOVar24;
  int i;
  uint uVar25;
  ulong uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  ON_3dPoint s;
  double t;
  ON_3dVector V_1;
  ON_3dVector W;
  ON_3dVector V;
  ON_3dVector VP;
  double local_110;
  double local_108;
  ON_3dPoint local_e8;
  ON_3dPoint *local_d0;
  ON_3dVector local_c8;
  double local_b0;
  ON_Line local_a8;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  uVar27 = 0xffffffff;
  uVar28 = 0x7fefffff;
  uVar26 = 0;
  uVar21 = 0;
  pOVar24 = this->m_V;
  do {
    ON_3dPoint::operator-((ON_3dVector *)&local_a8,P,pOVar24);
    dVar29 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&local_a8);
    if (dVar29 < (double)CONCAT44(uVar28,uVar27)) {
      uVar21 = uVar26 & 0xffffffff;
      uVar28 = (int)((ulong)dVar29 >> 0x20);
      uVar27 = SUB84(dVar29,0);
    }
    uVar26 = uVar26 + 1;
    pOVar24 = pOVar24 + 1;
  } while (uVar26 != 3);
  i_00 = (int)uVar21;
  pOVar24 = this->m_V + i_00;
  local_d0 = P;
  ON_3dPoint::operator-(&local_48,P,pOVar24);
  iVar15 = ((i_00 + 1) / 3) * -3 + i_00 + 1;
  ON_3dPoint::operator-(&local_60,this->m_V + iVar15,pOVar24);
  iVar16 = ((i_00 + 2) / 3) * -3 + i_00 + 2;
  ON_3dPoint::operator-(&local_78,this->m_V + iVar16,pOVar24);
  ON_3dPoint::ON_3dPoint(&local_e8,0.0,0.0,0.0);
  pdVar18 = ON_3dPoint::operator[](&local_e8,iVar15);
  y = ON_3dPoint::operator[](&local_e8,iVar16);
  iVar17 = ON_DecomposeVector(&local_48,&local_60,&local_78,pdVar18,y);
  if (iVar17 == 0) {
    ON_Line::ON_Line(&local_a8,this->m_V[1],this->m_V[2]);
    ON_Line::Direction(&local_c8,&local_a8);
    local_110 = ON_3dVector::LengthSquared(&local_c8);
    ON_Line::~ON_Line(&local_a8);
    lVar22 = 0;
    uVar21 = 0;
    uVar26 = 1;
    do {
      uVar1 = uVar26 + 1;
      uVar19 = 0;
      if (lVar22 != 0x18) {
        uVar19 = uVar1 & 0xffffffff;
      }
      uVar3 = this->m_V[uVar19].x;
      uVar4 = this->m_V[uVar19].y;
      from_pt.y = (double)uVar4;
      from_pt.x = (double)uVar3;
      from_pt.z = this->m_V[uVar19].z;
      to_pt.z = *(double *)((long)&this->m_V[0].z + lVar22);
      to_pt._0_16_ = *(undefined1 (*) [16])((long)&this->m_V[0].x + lVar22);
      ON_Line::ON_Line(&local_a8,from_pt,to_pt);
      ON_Line::Direction(&local_c8,&local_a8);
      local_b0 = ON_3dVector::LengthSquared(&local_c8);
      ON_Line::~ON_Line(&local_a8);
      dVar29 = local_b0;
      uVar19 = uVar26;
      if (local_b0 <= local_110) {
        dVar29 = local_110;
        uVar19 = uVar21;
      }
      uVar21 = uVar19 & 0xffffffff;
      lVar22 = lVar22 + 0x18;
      uVar26 = uVar1;
      local_110 = dVar29;
    } while (uVar1 != 3);
    iVar15 = (int)uVar19;
    iVar16 = iVar15 + ((iVar15 + 1) / 3) * -3 + 1;
    iVar15 = iVar15 + ((iVar15 + 2) / 3) * -3 + 2;
    uVar7 = this->m_V[iVar15].x;
    uVar8 = this->m_V[iVar15].y;
    to_pt_00.y = (double)uVar8;
    to_pt_00.x = (double)uVar7;
    uVar5 = this->m_V[iVar16].x;
    uVar6 = this->m_V[iVar16].y;
    from_pt_00.y = (double)uVar6;
    from_pt_00.x = (double)uVar5;
    from_pt_00.z = this->m_V[iVar16].z;
    to_pt_00.z = this->m_V[iVar15].z;
    ON_Line::ON_Line(&local_a8,from_pt_00,to_pt_00);
    bVar13 = ON_Line::ClosestPointTo(&local_a8,local_d0,&local_c8.x);
    ON_Line::~ON_Line(&local_a8);
    if (bVar13) {
      dVar29 = 1.0 - local_c8.x;
      pdVar18 = ON_3dPoint::operator[](&local_e8,iVar16);
      *pdVar18 = dVar29;
      pdVar18 = ON_3dPoint::operator[](&local_e8,iVar15);
      uVar28 = SUB84(local_c8.x,0);
      uVar27 = (undefined4)((ulong)local_c8.x >> 0x20);
LAB_004c85cf:
      *pdVar18 = (double)CONCAT44(uVar27,uVar28);
    }
  }
  else {
    pdVar18 = ON_3dPoint::operator[](&local_e8,iVar15);
    local_108 = 1.0;
    dVar29 = *pdVar18;
    pdVar18 = ON_3dPoint::operator[](&local_e8,iVar16);
    dVar2 = *pdVar18;
    pdVar18 = ON_3dPoint::operator[](&local_e8,i_00);
    pOVar24 = local_d0;
    *pdVar18 = (1.0 - dVar29) - dVar2;
    bVar13 = true;
    if (constrainInside) {
      uVar25 = 0xffffffff;
      do {
        uVar23 = uVar25 + 1;
        pdVar18 = ON_3dPoint::operator[](&local_e8,uVar23);
        if (*pdVar18 <= 0.0 && *pdVar18 != 0.0) {
          uVar23 = 0;
          if (uVar25 != 1) {
            uVar23 = uVar25 + 2;
          }
          uVar20 = 2;
          if (uVar25 != 0xffffffff) {
            uVar20 = uVar25;
          }
          uVar11 = this->m_V[(int)uVar20].x;
          uVar12 = this->m_V[(int)uVar20].y;
          to_pt_01.y = (double)uVar12;
          to_pt_01.x = (double)uVar11;
          uVar9 = this->m_V[uVar23].x;
          uVar10 = this->m_V[uVar23].y;
          from_pt_01.y = (double)uVar10;
          from_pt_01.x = (double)uVar9;
          from_pt_01.z = this->m_V[uVar23].z;
          to_pt_01.z = this->m_V[(int)uVar20].z;
          ON_Line::ON_Line(&local_a8,from_pt_01,to_pt_01);
          bVar14 = ON_Line::ClosestPointTo(&local_a8,pOVar24,&local_c8.x);
          ON_Line::~ON_Line(&local_a8);
          if (bVar14) {
            ON_3dPoint::ON_3dPoint(&local_a8.from,0.0,0.0,0.0);
            local_e8.z = local_a8.from.z;
            local_e8.x = local_a8.from.x;
            local_e8.y = local_a8.from.y;
            if (0.0 <= local_c8.x) {
              if (1.0 <= local_c8.x) {
                local_108 = 1.0;
                uVar23 = uVar20;
              }
              else {
                dVar29 = 1.0 - local_c8.x;
                pdVar18 = ON_3dPoint::operator[](&local_e8,uVar23);
                *pdVar18 = dVar29;
                local_108 = local_c8.x;
                uVar23 = uVar20;
              }
            }
            pdVar18 = ON_3dPoint::operator[](&local_e8,uVar23);
            uVar28 = SUB84(local_108,0);
            uVar27 = (undefined4)((ulong)local_108 >> 0x20);
            goto LAB_004c85cf;
          }
          break;
        }
        uVar25 = uVar23;
      } while (uVar23 != 2);
    }
  }
  if (s1 != (double *)0x0) {
    pdVar18 = ON_3dPoint::operator[](&local_e8,1);
    *s1 = *pdVar18;
  }
  if (s2 != (double *)0x0) {
    pdVar18 = ON_3dPoint::operator[](&local_e8,2);
    *s2 = *pdVar18;
  }
  return bVar13;
}

Assistant:

bool ON_Triangle::GetBarycentricCoordinates(
  const ON_3dPoint& P,
  bool constrainInside,
  double* s1, double* s2
) const
{
	bool rc = false;
	// Choose  base vertex v[i0] is closest to P
	int i0 = 0;
	double Min_norm = ON_DBL_MAX;
	for (int i = 0; i < 3; i++)
	{
		ON_3dVector V = P - m_V[i];
		double d = V.MaximumCoordinate();
		if (d < Min_norm)
		{
			i0 = i;
			Min_norm = d;
		}
	}

	ON_3dVector VP = P - m_V[i0];
	ON_3dVector V = m_V[(i0 + 1) % 3] - m_V[i0];
	ON_3dVector W = m_V[(i0 + 2) % 3] - m_V[i0];
	ON_3dPoint s(0, 0, 0);		// set to barycentric coordinates of solution

	if (ON_DecomposeVector(VP, V, W, &s[(i0 + 1) % 3], &s[(i0 + 2) % 3]))
	{
		// use decomposition
		s[i0] = 1 - s[(i0 + 1) % 3] - s[(i0 + 2) % 3];

    if (constrainInside)
		  for (int i = 0; i < 3; i++)
			  if (s[i] < 0)
			  {
				  double t;
				  if (Edge(i).ClosestPointTo(P, &t))	
				  {
					  s = ON_3dPoint( 0,0,0 );
					  if (t < 0)
					  {
						  s[(i + 1) % 3] = 1.0;
					  }

					  else if (t >= 1.0)
					  {
						  s[(i + 2) % 3] = 1.0;
					  }
					  else
					  {
						  s[(i + 1) % 3] = 1 - t;
						  s[(i + 2) % 3] = t;
					  }
				  }
				  break;
			  }
		rc = true;
	}
	else
	{
		// decomposition failed:
		// Find closest point to longest edge i0
		double max = Edge(0).Direction().LengthSquared();
    i0 = 0;
		for (int i = 1; i < 3; i++)
		{
			double lensq = Edge(i).Direction().LengthSquared();
			if (max < lensq)
			{
				i0 = i;
				max = lensq;
			}
		}
		double t;
		if (Edge(i0).ClosestPointTo(P, &t))
		{
			s[(i0 + 1) % 3] = (1 - t);
			s[(i0 + 2) % 3] = t;
			rc = true;
		}
	
	}
	if (s1)
		*s1 = s[1];
	if (s2)
		*s2 = s[2];
	return rc;
}